

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypt_and_hash.c
# Opt level: O1

int main(int argc,char **argv)

{
  mbedtls_cipher_type_t cipher_type;
  int *__s;
  uchar *input;
  byte bVar1;
  uchar uVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  FILE *__stream;
  FILE *__s_00;
  mbedtls_cipher_info_t *cipher_info;
  mbedtls_md_info_t *pmVar7;
  FILE *__stream_00;
  ulong uVar8;
  mbedtls_cipher_type_t *pmVar9;
  mbedtls_md_type_t *pmVar10;
  size_t sVar11;
  ulong uVar12;
  undefined8 *puVar13;
  size_t sVar14;
  ulong uVar15;
  long lVar16;
  char *pcVar17;
  mbedtls_md_type_t md_type;
  bool bVar18;
  size_t olen;
  int n;
  mbedtls_md_context_t md_ctx;
  uchar IV [16];
  mbedtls_cipher_context_t cipher_ctx;
  uchar key [512];
  uchar buffer [1024];
  uchar output [1024];
  size_t local_b28;
  mbedtls_md_info_t *local_b20;
  uint local_b18;
  uchar local_b14 [4];
  mbedtls_md_context_t local_b10;
  mbedtls_cipher_info_t *local_af8;
  char **local_af0;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  mbedtls_cipher_context_t local_ad0;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  uchar local_a38 [512];
  undefined8 local_838;
  undefined8 uStack_830;
  uchar local_438 [1032];
  
  mbedtls_cipher_init(&local_ad0);
  mbedtls_md_init(&local_b10);
  if (argc == 7) {
    uVar4 = atoi(argv[1]);
    if (uVar4 < 2) {
      pcVar17 = argv[2];
      iVar5 = strcmp(pcVar17,argv[3]);
      if (iVar5 == 0) {
        main_cold_25();
      }
      else {
        __stream = fopen(pcVar17,"rb");
        if (__stream != (FILE *)0x0) {
          __s_00 = fopen(argv[3],"wb+");
          if (__s_00 == (FILE *)0x0) {
            main_cold_23();
            goto LAB_00105fe1;
          }
          cipher_info = mbedtls_cipher_info_from_string(argv[4]);
          if (cipher_info == (mbedtls_cipher_info_t *)0x0) {
            main_cold_22();
            iVar5 = 1;
            goto LAB_00106159;
          }
          local_af0 = argv + 2;
          iVar5 = mbedtls_cipher_setup(&local_ad0,cipher_info);
          if (iVar5 != 0) {
            main_cold_1();
            goto LAB_00106159;
          }
          pmVar7 = mbedtls_md_info_from_string(argv[5]);
          if (pmVar7 == (mbedtls_md_info_t *)0x0) {
            main_cold_21();
          }
          else {
            local_b20 = pmVar7;
            iVar5 = mbedtls_md_setup(&local_b10,pmVar7,1);
            if (iVar5 == 0) {
              local_b18 = uVar4;
              __stream_00 = fopen(argv[6],"rb");
              local_af8 = cipher_info;
              if (__stream_00 == (FILE *)0x0) {
                __s = (int *)argv[6];
                if (*__s == 0x3a786568) {
                  uVar8 = 0;
                  iVar5 = __isoc99_sscanf(__s + 1,"%02X",local_b14);
                  if (0 < iVar5) {
                    lVar16 = (long)__s + 6;
                    uVar12 = 0;
                    do {
                      uVar8 = uVar12 + 1;
                      local_a38[uVar12] = local_b14[0];
                      iVar5 = __isoc99_sscanf(lVar16,"%02X",local_b14);
                      if (iVar5 < 1) break;
                      lVar16 = lVar16 + 2;
                      bVar18 = uVar12 < 0x1ff;
                      uVar12 = uVar8;
                    } while (bVar18);
                  }
                }
                else {
                  sVar11 = strlen((char *)__s);
                  uVar8 = 0x200;
                  if (sVar11 < 0x200) {
                    uVar8 = sVar11;
                  }
                  memcpy(local_a38,__s,uVar8);
                }
              }
              else {
                uVar8 = fread(local_a38,1,0x200,__stream_00);
                fclose(__stream_00);
              }
              pcVar17 = argv[6];
              sVar11 = strlen(pcVar17);
              memset(pcVar17,0,sVar11);
              iVar5 = fileno(__stream);
              uVar12 = lseek(iVar5,0,2);
              if ((long)uVar12 < 0) {
                perror("lseek");
              }
              else {
                iVar5 = fseek(__stream,0,0);
                if (iVar5 < 0) {
                  main_cold_20();
                }
                else {
                  if ((local_b18 & 1) != 0) {
LAB_00105bd2:
                    bVar1 = mbedtls_md_get_size(local_b20);
                    if ((long)uVar12 < (long)((ulong)bVar1 + 0x10)) {
                      main_cold_19();
                    }
                    else if ((local_ad0.cipher_info == (mbedtls_cipher_info_t *)0x0) ||
                            ((local_ad0.cipher_info)->block_size == 0)) {
                      main_cold_18();
                    }
                    else {
                      if (local_af8->mode != MBEDTLS_MODE_GCM) {
                        bVar1 = mbedtls_md_get_size(local_b20);
                        if (local_ad0.cipher_info == (mbedtls_cipher_info_t *)0x0) {
                          uVar15 = 0;
                        }
                        else {
                          uVar15 = (ulong)(local_ad0.cipher_info)->block_size;
                        }
                        if ((long)(uVar12 - bVar1) % (long)uVar15 != 0) {
                          iVar5 = 0;
                          uVar8 = 0;
                          if (local_ad0.cipher_info != (mbedtls_cipher_info_t *)0x0) {
                            uVar8 = (ulong)(local_ad0.cipher_info)->block_size;
                          }
                          fprintf(_stderr,"File content not a multiple of the block size (%d).\n",
                                  uVar8);
                          goto LAB_00106159;
                        }
                      }
                      bVar1 = mbedtls_md_get_size(local_b20);
                      sVar11 = fread(&local_838,1,0x10,__stream);
                      if (sVar11 == 0x10) {
                        uVar12 = (uVar12 - bVar1) - 0x10;
                        local_ae8 = local_838;
                        uStack_ae0 = uStack_830;
                        local_a68 = 0;
                        uStack_a60 = 0;
                        local_a78 = local_838;
                        uStack_a70 = uStack_830;
                        iVar5 = 0x2000;
                        do {
                          mbedtls_md_starts(&local_b10);
                          mbedtls_md_update(&local_b10,(uchar *)&local_a78,0x20);
                          mbedtls_md_update(&local_b10,local_a38,uVar8);
                          mbedtls_md_finish(&local_b10,(uchar *)&local_a78);
                          iVar5 = iVar5 + -1;
                        } while (iVar5 != 0);
                        iVar5 = 0;
                        memset(local_a38,0,0x200);
                        iVar6 = mbedtls_cipher_setkey
                                          (&local_ad0,(uchar *)&local_a78,local_af8->key_bitlen,
                                           MBEDTLS_DECRYPT);
                        if (iVar6 != 0) {
                          main_cold_11();
                          goto LAB_00106150;
                        }
                        iVar6 = mbedtls_cipher_set_iv(&local_ad0,(uchar *)&local_ae8,0x10);
                        if (iVar6 != 0) {
                          main_cold_12();
                          goto LAB_00106159;
                        }
                        iVar6 = mbedtls_cipher_reset(&local_ad0);
                        if (iVar6 != 0) {
                          main_cold_13();
                          goto LAB_00106159;
                        }
                        mbedtls_md_hmac_starts(&local_b10,(uchar *)&local_a78,0x20);
                        if (0 < (long)uVar12) {
                          lVar16 = 0;
                          do {
                            if (local_ad0.cipher_info == (mbedtls_cipher_info_t *)0x0) {
                              uVar8 = 0;
                            }
                            else {
                              uVar8 = (ulong)(local_ad0.cipher_info)->block_size;
                            }
                            if ((long)uVar8 < (long)((uVar12 & 0xffffffff) - lVar16)) {
                              if (local_ad0.cipher_info == (mbedtls_cipher_info_t *)0x0) {
                                uVar4 = 0;
                              }
                              else {
                                uVar4 = (local_ad0.cipher_info)->block_size;
                              }
                            }
                            else {
                              uVar4 = (int)uVar12 - (int)lVar16;
                            }
                            uVar8 = (ulong)uVar4;
                            sVar11 = fread(&local_838,1,uVar8,__stream);
                            if (sVar11 != uVar8) {
                              main_cold_14();
                              goto LAB_00106150;
                            }
                            mbedtls_md_hmac_update(&local_b10,(uchar *)&local_838,uVar8);
                            iVar5 = mbedtls_cipher_update
                                              (&local_ad0,(uchar *)&local_838,uVar8,local_438,
                                               &local_b28);
                            if (iVar5 != 0) {
                              main_cold_15();
                              goto LAB_00106150;
                            }
                            sVar11 = fwrite(local_438,1,local_b28,__s_00);
                            if (sVar11 != local_b28) goto LAB_0010608d;
                            if (local_ad0.cipher_info == (mbedtls_cipher_info_t *)0x0) {
                              uVar8 = 0;
                            }
                            else {
                              uVar8 = (ulong)(local_ad0.cipher_info)->block_size;
                            }
                            lVar16 = lVar16 + uVar8;
                          } while (lVar16 < (long)uVar12);
                        }
                        mbedtls_md_hmac_finish(&local_b10,(uchar *)&local_a78);
                        pmVar7 = local_b20;
                        bVar1 = mbedtls_md_get_size(local_b20);
                        sVar11 = fread(&local_838,1,(ulong)bVar1,__stream);
                        bVar1 = mbedtls_md_get_size(pmVar7);
                        if (sVar11 == bVar1) {
                          uVar2 = mbedtls_md_get_size(pmVar7);
                          iVar5 = 0;
                          if (uVar2 != '\0') {
                            uVar8 = 0;
                            bVar1 = 0;
                            do {
                              bVar1 = bVar1 | *(byte *)((long)&local_838 + uVar8) ^
                                              *(byte *)((long)&local_a78 + uVar8);
                              uVar8 = uVar8 + 1;
                              bVar3 = mbedtls_md_get_size(pmVar7);
                            } while (uVar8 < bVar3);
                            if (bVar1 != 0) {
                              main_cold_17();
                              goto LAB_001060e2;
                            }
                          }
                          mbedtls_cipher_finish(&local_ad0,local_438,&local_b28);
                          sVar11 = fwrite(local_438,1,local_b28,__s_00);
                          if (sVar11 == local_b28) goto LAB_00106159;
                          goto LAB_00105fb0;
                        }
                        main_cold_16();
                        goto LAB_001060e2;
                      }
                      main_cold_10();
                    }
                    goto LAB_00106060;
                  }
                  puVar13 = &local_838;
                  lVar16 = 0;
                  do {
                    *(char *)puVar13 = (char)(uVar12 >> ((byte)lVar16 & 0x3f));
                    lVar16 = lVar16 + 8;
                    puVar13 = (undefined8 *)((long)puVar13 + 1);
                  } while (lVar16 != 0x40);
                  input = (uchar *)*local_af0;
                  mbedtls_md_starts(&local_b10);
                  mbedtls_md_update(&local_b10,(uchar *)&local_838,8);
                  sVar11 = strlen((char *)input);
                  mbedtls_md_update(&local_b10,input,sVar11);
                  mbedtls_md_finish(&local_b10,(uchar *)&local_a78);
                  local_ae8 = local_a78;
                  uStack_ae0 = uStack_a70;
                  sVar11 = fwrite(&local_ae8,1,0x10,__s_00);
                  if (sVar11 != 0x10) {
                    main_cold_3();
                    goto LAB_00106150;
                  }
                  local_a68 = 0;
                  uStack_a60 = 0;
                  local_a78 = local_ae8;
                  uStack_a70 = uStack_ae0;
                  iVar5 = 0x2000;
                  do {
                    mbedtls_md_starts(&local_b10);
                    mbedtls_md_update(&local_b10,(uchar *)&local_a78,0x20);
                    mbedtls_md_update(&local_b10,local_a38,uVar8);
                    mbedtls_md_finish(&local_b10,(uchar *)&local_a78);
                    iVar5 = iVar5 + -1;
                  } while (iVar5 != 0);
                  memset(local_a38,0,0x200);
                  iVar5 = mbedtls_cipher_setkey
                                    (&local_ad0,(uchar *)&local_a78,local_af8->key_bitlen,
                                     MBEDTLS_ENCRYPT);
                  if (iVar5 == 0) {
                    iVar5 = mbedtls_cipher_set_iv(&local_ad0,(uchar *)&local_ae8,0x10);
                    if (iVar5 == 0) {
                      iVar5 = mbedtls_cipher_reset(&local_ad0);
                      if (iVar5 == 0) {
                        mbedtls_md_hmac_starts(&local_b10,(uchar *)&local_a78,0x20);
                        if (uVar12 != 0) {
                          local_af0 = (char **)(uVar12 & 0xffffffff);
                          lVar16 = 0;
                          do {
                            if (local_ad0.cipher_info == (mbedtls_cipher_info_t *)0x0) {
                              uVar15 = 0;
                            }
                            else {
                              uVar15 = (ulong)(local_ad0.cipher_info)->block_size;
                            }
                            if ((long)uVar15 < (long)local_af0 - lVar16) {
                              if (local_ad0.cipher_info == (mbedtls_cipher_info_t *)0x0) {
                                uVar4 = 0;
                              }
                              else {
                                uVar4 = (local_ad0.cipher_info)->block_size;
                              }
                            }
                            else {
                              uVar4 = (int)uVar12 - (int)lVar16;
                            }
                            sVar11 = (size_t)uVar4;
                            sVar14 = fread(&local_838,1,sVar11,__stream);
                            if (sVar14 != sVar11) {
                              pcVar17 = "fread(%ld bytes) failed\n";
                              goto LAB_0010613f;
                            }
                            iVar5 = mbedtls_cipher_update
                                              (&local_ad0,(uchar *)&local_838,sVar11,local_438,
                                               &local_b28);
                            if (iVar5 != 0) {
                              main_cold_7();
                              goto LAB_00106150;
                            }
                            mbedtls_md_hmac_update(&local_b10,local_438,local_b28);
                            sVar11 = fwrite(local_438,1,local_b28,__s_00);
                            if (sVar11 != local_b28) goto LAB_0010608d;
                            if (local_ad0.cipher_info == (mbedtls_cipher_info_t *)0x0) {
                              uVar15 = 0;
                            }
                            else {
                              uVar15 = (ulong)(local_ad0.cipher_info)->block_size;
                            }
                            lVar16 = lVar16 + uVar15;
                          } while (lVar16 < (long)uVar12);
                        }
                        iVar5 = mbedtls_cipher_finish(&local_ad0,local_438,&local_b28);
                        if (iVar5 == 0) {
                          mbedtls_md_hmac_update(&local_b10,local_438,local_b28);
                          sVar11 = fwrite(local_438,1,local_b28,__s_00);
                          if (sVar11 != local_b28) {
LAB_00105fb0:
                            iVar5 = 0;
                            fprintf(_stderr,"fwrite(%ld bytes) failed\n");
                            goto LAB_00106159;
                          }
                          mbedtls_md_hmac_finish(&local_b10,(uchar *)&local_a78);
                          pmVar7 = local_b20;
                          bVar1 = mbedtls_md_get_size(local_b20);
                          sVar11 = fwrite(&local_a78,1,(ulong)bVar1,__s_00);
                          bVar1 = mbedtls_md_get_size(pmVar7);
                          if (sVar11 == bVar1) {
                            if (local_b18 == 1) goto LAB_00105bd2;
                          }
                          else {
                            main_cold_9();
                          }
                        }
                        else {
                          main_cold_8();
                        }
                      }
                      else {
                        main_cold_6();
                      }
                    }
                    else {
                      main_cold_5();
                    }
                  }
                  else {
                    main_cold_4();
                  }
                }
              }
LAB_001060e2:
              iVar5 = 0;
              goto LAB_00106159;
            }
            main_cold_2();
          }
LAB_00106060:
          iVar5 = 0;
          goto LAB_00106159;
        }
        main_cold_24();
      }
    }
    else {
      main_cold_26();
    }
LAB_00105fde:
    __stream = (FILE *)0x0;
  }
  else {
    puts(
        "\n  crypt_and_hash <mode> <input filename> <output filename> <cipher> <mbedtls_md> <key>\n\n   <mode>: 0 = encrypt, 1 = decrypt\n\n  example: crypt_and_hash 0 file file.aes AES-128-CBC SHA1 hex:E76B2413958B00E193\n"
        );
    puts("Available ciphers:");
    pmVar9 = (mbedtls_cipher_type_t *)mbedtls_cipher_list();
    cipher_type = *pmVar9;
    while (cipher_type != MBEDTLS_CIPHER_NONE) {
      pmVar9 = pmVar9 + 1;
      mbedtls_cipher_info_from_type(cipher_type);
      printf("  %s\n");
      cipher_type = *pmVar9;
    }
    puts("\nAvailable message digests:");
    pmVar10 = (mbedtls_md_type_t *)mbedtls_md_list();
    md_type = *pmVar10;
    if (md_type == MBEDTLS_MD_NONE) goto LAB_00105fde;
    __stream = (FILE *)0x0;
    do {
      pmVar10 = pmVar10 + 1;
      pmVar7 = mbedtls_md_info_from_type(md_type);
      mbedtls_md_get_name(pmVar7);
      printf("  %s\n");
      md_type = *pmVar10;
    } while (md_type != MBEDTLS_MD_NONE);
  }
LAB_00105fe1:
  iVar5 = 1;
  __s_00 = (FILE *)0x0;
LAB_00106159:
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  if (__s_00 != (FILE *)0x0) {
    fclose(__s_00);
  }
  memset(&local_838,0,0x400);
  local_a78 = 0;
  uStack_a70 = 0;
  local_a68 = 0;
  uStack_a60 = 0;
  local_a58 = 0;
  uStack_a50 = 0;
  local_a48 = 0;
  uStack_a40 = 0;
  mbedtls_cipher_free(&local_ad0);
  mbedtls_md_free(&local_b10);
  return iVar5;
LAB_0010608d:
  pcVar17 = "fwrite(%ld bytes) failed\n";
  sVar11 = local_b28;
LAB_0010613f:
  fprintf(_stderr,pcVar17,sVar11);
LAB_00106150:
  iVar5 = 0;
  goto LAB_00106159;
}

Assistant:

int main( int argc, char *argv[] )
{
    int ret = 1, i, n;
    int mode;
    size_t keylen, ilen, olen;
    FILE *fkey, *fin = NULL, *fout = NULL;

    char *p;
    unsigned char IV[16];
    unsigned char key[512];
    unsigned char digest[MBEDTLS_MD_MAX_SIZE];
    unsigned char buffer[1024];
    unsigned char output[1024];
    unsigned char diff;

    const mbedtls_cipher_info_t *cipher_info;
    const mbedtls_md_info_t *md_info;
    mbedtls_cipher_context_t cipher_ctx;
    mbedtls_md_context_t md_ctx;
#if defined(_WIN32_WCE)
    long filesize, offset;
#elif defined(_WIN32)
       LARGE_INTEGER li_size;
    __int64 filesize, offset;
#else
      off_t filesize, offset;
#endif

    mbedtls_cipher_init( &cipher_ctx );
    mbedtls_md_init( &md_ctx );

    /*
     * Parse the command-line arguments.
     */
    if( argc != 7 )
    {
        const int *list;

        mbedtls_printf( USAGE );

        mbedtls_printf( "Available ciphers:\n" );
        list = mbedtls_cipher_list();
        while( *list )
        {
            cipher_info = mbedtls_cipher_info_from_type( *list );
            mbedtls_printf( "  %s\n", cipher_info->name );
            list++;
        }

        mbedtls_printf( "\nAvailable message digests:\n" );
        list = mbedtls_md_list();
        while( *list )
        {
            md_info = mbedtls_md_info_from_type( *list );
            mbedtls_printf( "  %s\n", mbedtls_md_get_name( md_info ) );
            list++;
        }

#if defined(_WIN32)
        mbedtls_printf( "\n  Press Enter to exit this program.\n" );
        fflush( stdout ); getchar();
#endif

        goto exit;
    }

    mode = atoi( argv[1] );

    if( mode != MODE_ENCRYPT && mode != MODE_DECRYPT )
    {
        mbedtls_fprintf( stderr, "invalid operation mode\n" );
        goto exit;
    }

    if( strcmp( argv[2], argv[3] ) == 0 )
    {
        mbedtls_fprintf( stderr, "input and output filenames must differ\n" );
        goto exit;
    }

    if( ( fin = fopen( argv[2], "rb" ) ) == NULL )
    {
        mbedtls_fprintf( stderr, "fopen(%s,rb) failed\n", argv[2] );
        goto exit;
    }

    if( ( fout = fopen( argv[3], "wb+" ) ) == NULL )
    {
        mbedtls_fprintf( stderr, "fopen(%s,wb+) failed\n", argv[3] );
        goto exit;
    }

    /*
     * Read the Cipher and MD from the command line
     */
    cipher_info = mbedtls_cipher_info_from_string( argv[4] );
    if( cipher_info == NULL )
    {
        mbedtls_fprintf( stderr, "Cipher '%s' not found\n", argv[4] );
        goto exit;
    }
    if( ( ret = mbedtls_cipher_setup( &cipher_ctx, cipher_info) ) != 0 )
    {
        mbedtls_fprintf( stderr, "mbedtls_cipher_setup failed\n" );
        goto exit;
    }

    md_info = mbedtls_md_info_from_string( argv[5] );
    if( md_info == NULL )
    {
        mbedtls_fprintf( stderr, "Message Digest '%s' not found\n", argv[5] );
        goto exit;
    }

    if( mbedtls_md_setup( &md_ctx, md_info, 1 ) != 0 )
    {
        mbedtls_fprintf( stderr, "mbedtls_md_setup failed\n" );
        goto exit;
    }

    /*
     * Read the secret key and clean the command line.
     */
    if( ( fkey = fopen( argv[6], "rb" ) ) != NULL )
    {
        keylen = fread( key, 1, sizeof( key ), fkey );
        fclose( fkey );
    }
    else
    {
        if( memcmp( argv[6], "hex:", 4 ) == 0 )
        {
            p = &argv[6][4];
            keylen = 0;

            while( sscanf( p, "%02X", &n ) > 0 &&
                   keylen < (int) sizeof( key ) )
            {
                key[keylen++] = (unsigned char) n;
                p += 2;
            }
        }
        else
        {
            keylen = strlen( argv[6] );

            if( keylen > (int) sizeof( key ) )
                keylen = (int) sizeof( key );

            memcpy( key, argv[6], keylen );
        }
    }

    memset( argv[6], 0, strlen( argv[6] ) );

#if defined(_WIN32_WCE)
    filesize = fseek( fin, 0L, SEEK_END );
#else
#if defined(_WIN32)
    /*
     * Support large files (> 2Gb) on Win32
     */
    li_size.QuadPart = 0;
    li_size.LowPart  =
        SetFilePointer( (HANDLE) _get_osfhandle( _fileno( fin ) ),
                        li_size.LowPart, &li_size.HighPart, FILE_END );

    if( li_size.LowPart == 0xFFFFFFFF && GetLastError() != NO_ERROR )
    {
        mbedtls_fprintf( stderr, "SetFilePointer(0,FILE_END) failed\n" );
        goto exit;
    }

    filesize = li_size.QuadPart;
#else
    if( ( filesize = lseek( fileno( fin ), 0, SEEK_END ) ) < 0 )
    {
        perror( "lseek" );
        goto exit;
    }
#endif
#endif

    if( fseek( fin, 0, SEEK_SET ) < 0 )
    {
        mbedtls_fprintf( stderr, "fseek(0,SEEK_SET) failed\n" );
        goto exit;
    }

    if( mode == MODE_ENCRYPT )
    {
        /*
         * Generate the initialization vector as:
         * IV = MD( filesize || filename )[0..15]
         */
        for( i = 0; i < 8; i++ )
            buffer[i] = (unsigned char)( filesize >> ( i << 3 ) );

        p = argv[2];

        mbedtls_md_starts( &md_ctx );
        mbedtls_md_update( &md_ctx, buffer, 8 );
        mbedtls_md_update( &md_ctx, (unsigned char *) p, strlen( p ) );
        mbedtls_md_finish( &md_ctx, digest );

        memcpy( IV, digest, 16 );

        /*
         * Append the IV at the beginning of the output.
         */
        if( fwrite( IV, 1, 16, fout ) != 16 )
        {
            mbedtls_fprintf( stderr, "fwrite(%d bytes) failed\n", 16 );
            goto exit;
        }

        /*
         * Hash the IV and the secret key together 8192 times
         * using the result to setup the AES context and HMAC.
         */
        memset( digest, 0,  32 );
        memcpy( digest, IV, 16 );

        for( i = 0; i < 8192; i++ )
        {
            mbedtls_md_starts( &md_ctx );
            mbedtls_md_update( &md_ctx, digest, 32 );
            mbedtls_md_update( &md_ctx, key, keylen );
            mbedtls_md_finish( &md_ctx, digest );

        }

        memset( key, 0, sizeof( key ) );

        if( mbedtls_cipher_setkey( &cipher_ctx, digest, cipher_info->key_bitlen,
                           MBEDTLS_ENCRYPT ) != 0 )
        {
            mbedtls_fprintf( stderr, "mbedtls_cipher_setkey() returned error\n");
            goto exit;
        }
        if( mbedtls_cipher_set_iv( &cipher_ctx, IV, 16 ) != 0 )
        {
            mbedtls_fprintf( stderr, "mbedtls_cipher_set_iv() returned error\n");
            goto exit;
        }
        if( mbedtls_cipher_reset( &cipher_ctx ) != 0 )
        {
            mbedtls_fprintf( stderr, "mbedtls_cipher_reset() returned error\n");
            goto exit;
        }

        mbedtls_md_hmac_starts( &md_ctx, digest, 32 );

        /*
         * Encrypt and write the ciphertext.
         */
        for( offset = 0; offset < filesize; offset += mbedtls_cipher_get_block_size( &cipher_ctx ) )
        {
            ilen = ( (unsigned int) filesize - offset > mbedtls_cipher_get_block_size( &cipher_ctx ) ) ?
                mbedtls_cipher_get_block_size( &cipher_ctx ) : (unsigned int) ( filesize - offset );

            if( fread( buffer, 1, ilen, fin ) != ilen )
            {
                mbedtls_fprintf( stderr, "fread(%ld bytes) failed\n", (long) ilen );
                goto exit;
            }

            if( mbedtls_cipher_update( &cipher_ctx, buffer, ilen, output, &olen ) != 0 )
            {
                mbedtls_fprintf( stderr, "mbedtls_cipher_update() returned error\n");
                goto exit;
            }

            mbedtls_md_hmac_update( &md_ctx, output, olen );

            if( fwrite( output, 1, olen, fout ) != olen )
            {
                mbedtls_fprintf( stderr, "fwrite(%ld bytes) failed\n", (long) olen );
                goto exit;
            }
        }

        if( mbedtls_cipher_finish( &cipher_ctx, output, &olen ) != 0 )
        {
            mbedtls_fprintf( stderr, "mbedtls_cipher_finish() returned error\n" );
            goto exit;
        }
        mbedtls_md_hmac_update( &md_ctx, output, olen );

        if( fwrite( output, 1, olen, fout ) != olen )
        {
            mbedtls_fprintf( stderr, "fwrite(%ld bytes) failed\n", (long) olen );
            goto exit;
        }

        /*
         * Finally write the HMAC.
         */
        mbedtls_md_hmac_finish( &md_ctx, digest );

        if( fwrite( digest, 1, mbedtls_md_get_size( md_info ), fout ) != mbedtls_md_get_size( md_info ) )
        {
            mbedtls_fprintf( stderr, "fwrite(%d bytes) failed\n", mbedtls_md_get_size( md_info ) );
            goto exit;
        }
    }

    if( mode == MODE_DECRYPT )
    {
        /*
         *  The encrypted file must be structured as follows:
         *
         *        00 .. 15              Initialization Vector
         *        16 .. 31              Encrypted Block #1
         *           ..
         *      N*16 .. (N+1)*16 - 1    Encrypted Block #N
         *  (N+1)*16 .. (N+1)*16 + n    Hash(ciphertext)
         */
        if( filesize < 16 + mbedtls_md_get_size( md_info ) )
        {
            mbedtls_fprintf( stderr, "File too short to be encrypted.\n" );
            goto exit;
        }

        if( mbedtls_cipher_get_block_size( &cipher_ctx ) == 0 )
        {
            mbedtls_fprintf( stderr, "Invalid cipher block size: 0. \n" );
            goto exit;
        }

        /*
         * Check the file size.
         */
        if( cipher_info->mode != MBEDTLS_MODE_GCM &&
            ( ( filesize - mbedtls_md_get_size( md_info ) ) %
                mbedtls_cipher_get_block_size( &cipher_ctx ) ) != 0 )
        {
            mbedtls_fprintf( stderr, "File content not a multiple of the block size (%d).\n",
                     mbedtls_cipher_get_block_size( &cipher_ctx ));
            goto exit;
        }

        /*
         * Subtract the IV + HMAC length.
         */
        filesize -= ( 16 + mbedtls_md_get_size( md_info ) );

        /*
         * Read the IV and original filesize modulo 16.
         */
        if( fread( buffer, 1, 16, fin ) != 16 )
        {
            mbedtls_fprintf( stderr, "fread(%d bytes) failed\n", 16 );
            goto exit;
        }

        memcpy( IV, buffer, 16 );

        /*
         * Hash the IV and the secret key together 8192 times
         * using the result to setup the AES context and HMAC.
         */
        memset( digest, 0,  32 );
        memcpy( digest, IV, 16 );

        for( i = 0; i < 8192; i++ )
        {
            mbedtls_md_starts( &md_ctx );
            mbedtls_md_update( &md_ctx, digest, 32 );
            mbedtls_md_update( &md_ctx, key, keylen );
            mbedtls_md_finish( &md_ctx, digest );
        }

        memset( key, 0, sizeof( key ) );

        if( mbedtls_cipher_setkey( &cipher_ctx, digest, cipher_info->key_bitlen,
                           MBEDTLS_DECRYPT ) != 0 )
        {
            mbedtls_fprintf( stderr, "mbedtls_cipher_setkey() returned error\n" );
            goto exit;
        }

        if( mbedtls_cipher_set_iv( &cipher_ctx, IV, 16 ) != 0 )
        {
            mbedtls_fprintf( stderr, "mbedtls_cipher_set_iv() returned error\n" );
            goto exit;
        }

        if( mbedtls_cipher_reset( &cipher_ctx ) != 0 )
        {
            mbedtls_fprintf( stderr, "mbedtls_cipher_reset() returned error\n" );
            goto exit;
        }

        mbedtls_md_hmac_starts( &md_ctx, digest, 32 );

        /*
         * Decrypt and write the plaintext.
         */
        for( offset = 0; offset < filesize; offset += mbedtls_cipher_get_block_size( &cipher_ctx ) )
        {
            ilen = ( (unsigned int) filesize - offset > mbedtls_cipher_get_block_size( &cipher_ctx ) ) ?
                mbedtls_cipher_get_block_size( &cipher_ctx ) : (unsigned int) ( filesize - offset );

            if( fread( buffer, 1, ilen, fin ) != ilen )
            {
                mbedtls_fprintf( stderr, "fread(%d bytes) failed\n",
                    mbedtls_cipher_get_block_size( &cipher_ctx ) );
                goto exit;
            }

            mbedtls_md_hmac_update( &md_ctx, buffer, ilen );
            if( mbedtls_cipher_update( &cipher_ctx, buffer, ilen, output,
                                       &olen ) != 0 )
            {
                mbedtls_fprintf( stderr, "mbedtls_cipher_update() returned error\n" );
                goto exit;
            }

            if( fwrite( output, 1, olen, fout ) != olen )
            {
                mbedtls_fprintf( stderr, "fwrite(%ld bytes) failed\n", (long) olen );
                goto exit;
            }
        }

        /*
         * Verify the message authentication code.
         */
        mbedtls_md_hmac_finish( &md_ctx, digest );

        if( fread( buffer, 1, mbedtls_md_get_size( md_info ), fin ) != mbedtls_md_get_size( md_info ) )
        {
            mbedtls_fprintf( stderr, "fread(%d bytes) failed\n", mbedtls_md_get_size( md_info ) );
            goto exit;
        }

        /* Use constant-time buffer comparison */
        diff = 0;
        for( i = 0; i < mbedtls_md_get_size( md_info ); i++ )
            diff |= digest[i] ^ buffer[i];

        if( diff != 0 )
        {
            mbedtls_fprintf( stderr, "HMAC check failed: wrong key, "
                             "or file corrupted.\n" );
            goto exit;
        }

        /*
         * Write the final block of data
         */
        mbedtls_cipher_finish( &cipher_ctx, output, &olen );

        if( fwrite( output, 1, olen, fout ) != olen )
        {
            mbedtls_fprintf( stderr, "fwrite(%ld bytes) failed\n", (long) olen );
            goto exit;
        }
    }

    ret = 0;

exit:
    if( fin )
        fclose( fin );
    if( fout )
        fclose( fout );

    memset( buffer, 0, sizeof( buffer ) );
    memset( digest, 0, sizeof( digest ) );

    mbedtls_cipher_free( &cipher_ctx );
    mbedtls_md_free( &md_ctx );

    return( ret );
}